

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

void lws_wsi_mux_insert(lws *wsi,lws *parent_wsi,int sid)

{
  uint *puVar1;
  
  (wsi->mux).my_sid = sid;
  (wsi->mux).parent_wsi = parent_wsi;
  wsi->role_ops = parent_wsi->role_ops;
  (wsi->mux).sibling_list = (parent_wsi->mux).child_list;
  (parent_wsi->mux).child_list = wsi;
  puVar1 = &(parent_wsi->mux).child_count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
lws_wsi_mux_insert(struct lws *wsi, struct lws *parent_wsi, int sid)
{
	wsi->mux.my_sid = sid;
	wsi->mux.parent_wsi = parent_wsi;
	wsi->role_ops = parent_wsi->role_ops;

	/* new guy's sibling is whoever was the first child before */
	wsi->mux.sibling_list = parent_wsi->mux.child_list;

	/* first child is now the new guy */
	parent_wsi->mux.child_list = wsi;

	parent_wsi->mux.child_count++;
}